

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kx.h
# Opt level: O2

int hydro_kx_nk_3(hydro_kx_state *state,hydro_kx_session_keypair *kp,uint8_t *packet2)

{
  int iVar1;
  int iVar2;
  
  hydro_hash_update(&state->h_st,packet2,0x20);
  iVar1 = hydro_kx_dh(state,(state->eph_kp).sk,packet2);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = hydro_kx_aead_decrypt(state,(uint8_t *)0x0,packet2 + 0x20,0x10);
    if (iVar1 == 0) {
      hydro_kx_final(state,kp->rx,kp->tx);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
hydro_kx_nk_3(hydro_kx_state *state, hydro_kx_session_keypair *kp,
              const uint8_t packet2[hydro_kx_NK_PACKET2BYTES])
{
    const uint8_t *peer_eph_pk = &packet2[0];
    const uint8_t *packet2_mac = &packet2[hydro_kx_PUBLICKEYBYTES];

    hydro_hash_update(&state->h_st, peer_eph_pk, hydro_x25519_PUBLICKEYBYTES);
    if (hydro_kx_dh(state, state->eph_kp.sk, peer_eph_pk) != 0 ||
        hydro_kx_aead_decrypt(state, NULL, packet2_mac, hydro_kx_AEAD_MACBYTES) != 0) {
        return -1;
    }
    hydro_kx_final(state, kp->rx, kp->tx);

    return 0;
}